

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  char cVar1;
  long lVar2;
  sqlite3_file *psVar3;
  PCache *pPVar4;
  sqlite3_io_methods *psVar5;
  u8 uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Btree *p;
  BtShared *pBVar11;
  Pager *pPVar12;
  ulong uVar13;
  sqlite3_mutex *psVar14;
  sqlite3_mutex *psVar15;
  void *pvVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  code *pcVar20;
  Btree *pBVar21;
  Btree *pBVar22;
  uint uVar23;
  Btree *pBVar24;
  Btree *pBVar25;
  Btree **ppBVar26;
  int n;
  char *pcVar27;
  u8 uVar28;
  BtShared **ppBVar29;
  byte bVar30;
  uint uVar31;
  bool bVar32;
  bool bVar33;
  char *local_108;
  uint local_fc;
  sqlite3_mutex *local_f8;
  char *local_d8;
  byte local_cc;
  char *local_c0;
  uint local_9c;
  uchar zDbHeader [100];
  
  if (zFilename == (char *)0x0) {
LAB_0014264c:
    bVar32 = true;
    if (db->temp_store != '\x02') goto LAB_00142663;
LAB_00142656:
    local_fc = flags | 2;
    uVar17 = 1;
  }
  else {
    cVar1 = *zFilename;
    bVar32 = cVar1 == '\0';
    iVar7 = strcmp(zFilename,":memory:");
    if (iVar7 == 0) goto LAB_00142656;
    if (cVar1 == '\0') goto LAB_0014264c;
    bVar32 = false;
LAB_00142663:
    uVar17 = (vfsFlags & 0x80U) >> 7;
    local_fc = flags | (vfsFlags & 0x80U) >> 6;
  }
  uVar31 = vfsFlags & 0xfffffcffU | 0x200;
  if (uVar17 == 0 && !bVar32) {
    uVar31 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar31 = vfsFlags;
  }
  p = (Btree *)sqlite3MallocZero(0x48);
  iVar7 = 7;
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->inTrans = '\0';
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  local_cc = (byte)uVar17;
  if ((!bVar32) && ((uVar31 >> 0x11 & 1) != 0 && ((uVar31 & 0x40) == 0 & local_cc) == 0)) {
    n = pVfs->mxPathname + 1;
    pcVar27 = (char *)sqlite3Malloc(n);
    p->sharable = '\x01';
    if (pcVar27 == (char *)0x0) {
LAB_00142926:
      sqlite3_free(p);
      return iVar7;
    }
    if (local_cc == 0) {
      *pcVar27 = '\0';
      iVar7 = (*pVfs->xFullPathname)(pVfs,zFilename,n,pcVar27);
      if (iVar7 != 0) {
        sqlite3_free(pcVar27);
        goto LAB_00142926;
      }
    }
    else {
      iVar7 = sqlite3Strlen30(zFilename);
      memcpy(pcVar27,zFilename,(ulong)(iVar7 + 1));
    }
    bVar32 = true;
    if (sqlite3Config.bCoreMutex == 0) {
      psVar14 = (sqlite3_mutex *)0x0;
      bVar33 = true;
      local_f8 = (sqlite3_mutex *)0x0;
    }
    else {
      local_f8 = (*sqlite3Config.mutex.xMutexAlloc)(4);
      bVar33 = local_f8 == (sqlite3_mutex *)0x0;
      if (!bVar33) {
        (*sqlite3Config.mutex.xMutexEnter)(local_f8);
      }
      if ((sqlite3Config.bCoreMutex == 0) ||
         (psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar14 == (sqlite3_mutex *)0x0)) {
        psVar14 = (sqlite3_mutex *)0x0;
        bVar32 = true;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar14);
        bVar32 = false;
      }
    }
    ppBVar29 = &sqlite3SharedCacheList;
LAB_00142c65:
    pBVar11 = *ppBVar29;
    if (pBVar11 != (BtShared *)0x0) {
      pPVar12 = pBVar11->pPager;
      iVar7 = strcmp(pcVar27,pPVar12->zFilename);
      if ((iVar7 != 0) || (pPVar12->pVfs != pVfs)) goto LAB_00142c94;
      uVar13 = (ulong)(uint)db->nDb;
      lVar18 = uVar13 * 0x20 + -0x18;
      for (; 0 < (int)uVar13; uVar13 = (ulong)((int)uVar13 - 1)) {
        lVar2 = *(long *)((long)&db->aDb->zName + lVar18);
        if ((lVar2 != 0) && (*(BtShared **)(lVar2 + 8) == pBVar11)) {
          if (!bVar32) {
            (*sqlite3Config.mutex.xMutexLeave)(psVar14);
          }
          if (!bVar33) {
            (*sqlite3Config.mutex.xMutexLeave)(local_f8);
          }
          sqlite3_free(pcVar27);
          sqlite3_free(p);
          return 0x13;
        }
        lVar18 = lVar18 + -0x20;
      }
      p->pBt = pBVar11;
      pBVar11->nRef = pBVar11->nRef + 1;
    }
    if (!bVar32) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar14);
    }
    sqlite3_free(pcVar27);
    if (pBVar11 == (BtShared *)0x0) goto LAB_001426f5;
    goto LAB_00142d3c;
  }
  local_f8 = (sqlite3_mutex *)0x0;
LAB_001426f5:
  pBVar11 = (BtShared *)sqlite3MallocZero(0x88);
  if (pBVar11 == (BtShared *)0x0) {
    iVar7 = 7;
  }
  else {
    zDbHeader[0] = '\0';
    zDbHeader[1] = '\x04';
    zDbHeader[2] = '\0';
    zDbHeader[3] = '\0';
    uVar17 = 0x30;
    if (0x30 < pVfs->szOsFile) {
      uVar17 = pVfs->szOsFile + 7U & 0xfffffff8;
    }
    pBVar11->pPager = (Pager *)0x0;
    uVar23 = local_fc & 2;
    local_c0 = zFilename;
    if (uVar23 == 0) {
      if (zFilename == (char *)0x0) {
        local_c0 = (char *)0x0;
        bVar32 = true;
LAB_00142a1a:
        uVar6 = '\0';
        goto LAB_00142a43;
      }
      if (*zFilename == '\0') {
        bVar32 = false;
        goto LAB_00142a1a;
      }
      iVar7 = pVfs->mxPathname;
      local_108 = (char *)sqlite3Malloc(iVar7 * 2 + 2);
      if (local_108 != (char *)0x0) {
        *local_108 = '\0';
        iVar7 = (*pVfs->xFullPathname)(pVfs,zFilename,iVar7 + 1,local_108);
        uVar8 = sqlite3Strlen30(local_108);
        uVar9 = sqlite3Strlen30(zFilename);
        local_d8 = zFilename + (ulong)uVar9 + 1;
        for (pcVar27 = local_d8; *pcVar27 != '\0';
            pcVar27 = pcVar27 + (ulong)uVar10 + (ulong)uVar9 + 2) {
          uVar9 = sqlite3Strlen30(pcVar27);
          uVar10 = sqlite3Strlen30(pcVar27 + (ulong)uVar9 + 1);
        }
        if (iVar7 != 0) {
LAB_001429ea:
          sqlite3_free(local_108);
          goto LAB_001430f3;
        }
        if (pVfs->mxPathname < (int)(uVar8 + 8)) {
          sqlite3CantopenError(0xa79a);
          iVar7 = 0xe;
          goto LAB_001429ea;
        }
        iVar7 = ((int)pcVar27 - (int)local_d8) + 1;
        bVar32 = false;
        uVar6 = '\0';
        goto LAB_00142a5f;
      }
LAB_001429a7:
      iVar7 = 7;
    }
    else {
      if (zFilename == (char *)0x0) {
        uVar6 = '\x01';
        local_c0 = (char *)0x0;
        bVar32 = true;
LAB_00142a43:
        local_108 = (char *)0x0;
        uVar8 = 0;
      }
      else {
        if (*zFilename == '\0') {
          uVar6 = '\x01';
          bVar32 = false;
          goto LAB_00142a43;
        }
        local_108 = sqlite3DbStrDup((sqlite3 *)0x0,zFilename);
        if (local_108 == (char *)0x0) goto LAB_001429a7;
        uVar8 = sqlite3Strlen30(local_108);
        bVar32 = true;
        local_c0 = (char *)0x0;
        uVar6 = '\x01';
      }
      local_d8 = (char *)0x0;
      iVar7 = 0;
LAB_00142a5f:
      pPVar12 = (Pager *)sqlite3MallocZero((pVfs->szOsFile + 7U & 0xfffffff8) +
                                           uVar8 * 3 + uVar17 * 2 + iVar7 + 0x189);
      if (pPVar12 == (Pager *)0x0) {
        sqlite3_free(local_108);
        iVar7 = 7;
      }
      else {
        pPVar12->pPCache = (PCache *)(pPVar12 + 1);
        pPVar12->fd = (sqlite3_file *)&pPVar12[1].jfd;
        pcVar27 = pPVar12[1].dbFileVers + (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x34);
        pPVar12->sjfd = (sqlite3_file *)pcVar27;
        pPVar12->jfd = (sqlite3_file *)(pcVar27 + (int)uVar17);
        pcVar27 = pcVar27 + (int)uVar17 + (int)uVar17;
        pPVar12->zFilename = pcVar27;
        if (local_108 != (char *)0x0) {
          uVar13 = (ulong)uVar8;
          pPVar12->zJournal = pcVar27 + (int)(iVar7 + uVar8 + 1);
          memcpy(pcVar27,local_108,uVar13);
          if (iVar7 != 0) {
            memcpy(pPVar12->zFilename + (uVar8 + 1),local_d8,(long)iVar7);
          }
          memcpy(pPVar12->zJournal,local_108,uVar13);
          builtin_strncpy(pPVar12->zJournal + uVar13,"-journal",9);
          (pPVar12->zJournal + uVar13 + 8)[1] = '\0';
          pPVar12->zWal = pPVar12->zJournal + uVar13 + 9;
          memcpy(pPVar12->zJournal + uVar13 + 9,local_108,uVar13);
          builtin_strncpy(pPVar12->zWal + uVar13,"-wal",5);
          sqlite3_free(local_108);
        }
        pPVar12->pVfs = pVfs;
        pPVar12->vfsFlags = uVar31;
        if ((bVar32) || (*local_c0 == '\0')) {
          pPVar12->eState = '\x01';
          pPVar12->eLock = '\x04';
          bVar30 = (byte)uVar31 & 1;
          uVar28 = '\x01';
          bVar32 = false;
LAB_00142e4b:
          iVar7 = sqlite3PagerSetPagesize(pPVar12,(u32 *)zDbHeader,-1);
          if (iVar7 == 0) {
            pcVar20 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            if (uVar23 == 0) {
              pcVar20 = pagerStress;
            }
            pPVar4 = pPVar12->pPCache;
            pPVar4->szPage = 0;
            pPVar4->szExtra = 0;
            *(undefined8 *)&pPVar4->bPurgeable = 0;
            pPVar4->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
            pPVar4->pStress = (void *)0x0;
            pPVar4->pSynced = (PgHdr *)0x0;
            pPVar4->nRef = 0;
            pPVar4->szCache = 0;
            pPVar4->pCache = (sqlite3_pcache *)0x0;
            pPVar4->pPage1 = (PgHdr *)0x0;
            pPVar4->pDirty = (PgHdr *)0x0;
            pPVar4->pDirtyTail = (PgHdr *)0x0;
            pPVar4->szPage = zDbHeader._0_4_;
            pPVar4->szExtra = 0x78;
            pPVar4->bPurgeable = uVar23 >> 1 ^ 1;
            pPVar4->xStress = pcVar20;
            pPVar4->pStress = pPVar12;
            pPVar4->szCache = 100;
            pPVar12->useJournal = (byte)(local_fc & 1) ^ 1;
            pPVar12->mxPgno = 0x3fffffff;
            pPVar12->tempFile = uVar28;
            pPVar12->exclusiveMode = uVar28;
            pPVar12->changeCountDone = uVar28;
            pPVar12->memDb = uVar6;
            pPVar12->readOnly = bVar30;
            pPVar12->noSync = uVar28;
            if (bVar32) {
              pPVar12->fullSync = '\x01';
              pPVar12->ckptSyncFlags = '\x02';
              pPVar12->walSyncFlags = '\"';
              pPVar12->syncFlags = '\x02';
            }
            pPVar12->nExtra = 0x78;
            pPVar12->journalSizeLimit = -1;
            setSectorSize(pPVar12);
            if ((local_fc & 3) != 0) {
              pPVar12->journalMode = ((local_fc & 1) == 0) * '\x02' + '\x02';
            }
            pPVar12->xReiniter = pageReinit;
            pBVar11->pPager = pPVar12;
            pPVar12->szMmap = db->szMmap;
            pagerFixMaplimit(pPVar12);
            zDbHeader[0x50] = '\0';
            zDbHeader[0x51] = '\0';
            zDbHeader[0x52] = '\0';
            zDbHeader[0x53] = '\0';
            zDbHeader[0x54] = '\0';
            zDbHeader[0x55] = '\0';
            zDbHeader[0x56] = '\0';
            zDbHeader[0x57] = '\0';
            zDbHeader[0x58] = '\0';
            zDbHeader[0x59] = '\0';
            zDbHeader[0x5a] = '\0';
            zDbHeader[0x5b] = '\0';
            zDbHeader[0x5c] = '\0';
            zDbHeader[0x5d] = '\0';
            zDbHeader[0x5e] = '\0';
            zDbHeader[0x5f] = '\0';
            zDbHeader[0x40] = '\0';
            zDbHeader[0x41] = '\0';
            zDbHeader[0x42] = '\0';
            zDbHeader[0x43] = '\0';
            zDbHeader[0x44] = '\0';
            zDbHeader[0x45] = '\0';
            zDbHeader[0x46] = '\0';
            zDbHeader[0x47] = '\0';
            zDbHeader[0x48] = '\0';
            zDbHeader[0x49] = '\0';
            zDbHeader[0x4a] = '\0';
            zDbHeader[0x4b] = '\0';
            zDbHeader[0x4c] = '\0';
            zDbHeader[0x4d] = '\0';
            zDbHeader[0x4e] = '\0';
            zDbHeader[0x4f] = '\0';
            zDbHeader[0x30] = '\0';
            zDbHeader[0x31] = '\0';
            zDbHeader[0x32] = '\0';
            zDbHeader[0x33] = '\0';
            zDbHeader[0x34] = '\0';
            zDbHeader[0x35] = '\0';
            zDbHeader[0x36] = '\0';
            zDbHeader[0x37] = '\0';
            zDbHeader[0x38] = '\0';
            zDbHeader[0x39] = '\0';
            zDbHeader[0x3a] = '\0';
            zDbHeader[0x3b] = '\0';
            zDbHeader[0x3c] = '\0';
            zDbHeader[0x3d] = '\0';
            zDbHeader[0x3e] = '\0';
            zDbHeader[0x3f] = '\0';
            zDbHeader[0x20] = '\0';
            zDbHeader[0x21] = '\0';
            zDbHeader[0x22] = '\0';
            zDbHeader[0x23] = '\0';
            zDbHeader[0x24] = '\0';
            zDbHeader[0x25] = '\0';
            zDbHeader[0x26] = '\0';
            zDbHeader[0x27] = '\0';
            zDbHeader[0x28] = '\0';
            zDbHeader[0x29] = '\0';
            zDbHeader[0x2a] = '\0';
            zDbHeader[0x2b] = '\0';
            zDbHeader[0x2c] = '\0';
            zDbHeader[0x2d] = '\0';
            zDbHeader[0x2e] = '\0';
            zDbHeader[0x2f] = '\0';
            zDbHeader[0x10] = '\0';
            zDbHeader[0x11] = '\0';
            zDbHeader[0x12] = '\0';
            zDbHeader[0x13] = '\0';
            zDbHeader[0x14] = '\0';
            zDbHeader[0x15] = '\0';
            zDbHeader[0x16] = '\0';
            zDbHeader[0x17] = '\0';
            zDbHeader[0x18] = '\0';
            zDbHeader[0x19] = '\0';
            zDbHeader[0x1a] = '\0';
            zDbHeader[0x1b] = '\0';
            zDbHeader[0x1c] = '\0';
            zDbHeader[0x1d] = '\0';
            zDbHeader[0x1e] = '\0';
            zDbHeader[0x1f] = '\0';
            zDbHeader[0x60] = '\0';
            zDbHeader[0x61] = '\0';
            zDbHeader[0x62] = '\0';
            zDbHeader[99] = '\0';
            zDbHeader[0] = '\0';
            zDbHeader[1] = '\0';
            zDbHeader[2] = '\0';
            zDbHeader[3] = '\0';
            zDbHeader[4] = '\0';
            zDbHeader[5] = '\0';
            zDbHeader[6] = '\0';
            zDbHeader[7] = '\0';
            zDbHeader[8] = '\0';
            zDbHeader[9] = '\0';
            zDbHeader[10] = '\0';
            zDbHeader[0xb] = '\0';
            zDbHeader[0xc] = '\0';
            zDbHeader[0xd] = '\0';
            zDbHeader[0xe] = '\0';
            zDbHeader[0xf] = '\0';
            psVar3 = pBVar11->pPager->fd;
            psVar5 = psVar3->pMethods;
            if (((psVar5 == (sqlite3_io_methods *)0x0) ||
                (iVar7 = (*psVar5->xRead)(psVar3,zDbHeader,100,0), iVar7 == 0x20a)) || (iVar7 == 0))
            {
              pBVar11->openFlags = (u8)local_fc;
              pBVar11->db = db;
              pPVar12 = pBVar11->pPager;
              pPVar12->xBusyHandler = btreeInvokeBusyHandler;
              pPVar12->pBusyHandlerArg = pBVar11;
              psVar5 = pPVar12->fd->pMethods;
              if (psVar5 != (sqlite3_io_methods *)0x0) {
                (*psVar5->xFileControl)(pPVar12->fd,0xf,&pPVar12->xBusyHandler);
                pPVar12 = pBVar11->pPager;
              }
              p->pBt = pBVar11;
              pBVar11->pCursor = (BtCursor *)0x0;
              pBVar11->pPage1 = (MemPage *)0x0;
              if (pPVar12->readOnly != '\0') {
                *(byte *)&pBVar11->btsFlags = (byte)pBVar11->btsFlags | 1;
              }
              iVar7 = (int)((zDbHeader._16_8_ & 0xff) << 8);
              uVar17 = (uint)zDbHeader[0x11] * 0x10000 + iVar7;
              pBVar11->pageSize = uVar17;
              if (((iVar7 + (uint)zDbHeader[0x11] * 0x10000) - 0x10001 < 0xffff01ff) ||
                 ((uVar17 + 0x1ffff & uVar17) != 0)) {
                pBVar11->pageSize = 0;
                uVar17 = 0;
                if (zFilename != (char *)0x0 && local_cc == 0) {
                  pBVar11->autoVacuum = '\0';
                  pBVar11->incrVacuum = '\0';
                  uVar17 = 0;
                }
              }
              else {
                uVar17 = (uint)zDbHeader[0x14];
                pBVar11->btsFlags = pBVar11->btsFlags | 2;
                pBVar11->autoVacuum =
                     (((uint)zDbHeader._52_4_ >> 0x18 != 0 ||
                      (zDbHeader._48_8_ & 0xff000000000000) != 0) ||
                     (zDbHeader._48_8_ & 0xff0000000000) != 0) ||
                     (zDbHeader._48_8_ & 0xff00000000) != 0;
                pBVar11->incrVacuum =
                     (((uint)zDbHeader._64_4_ >> 0x18 != 0 || (zDbHeader._64_8_ & 0xff0000) != 0) ||
                     (zDbHeader._64_8_ & 0xff00) != 0) || (zDbHeader._64_8_ & 0xff) != 0;
              }
              iVar7 = sqlite3PagerSetPagesize(pPVar12,&pBVar11->pageSize,uVar17);
              if (iVar7 == 0) {
                pBVar11->usableSize = pBVar11->pageSize - uVar17;
                if (p->sharable != '\0') {
                  pBVar11->nRef = 1;
                  if (sqlite3Config.bCoreMutex != 0) {
                    psVar14 = (*sqlite3Config.mutex.xMutexAlloc)(2);
                    if (sqlite3Config.bCoreMutex != 0) {
                      psVar15 = (*sqlite3Config.mutex.xMutexAlloc)(0);
                      pBVar11->mutex = psVar15;
                      if (psVar15 == (sqlite3_mutex *)0x0) {
                        db->mallocFailed = '\0';
                        iVar7 = 7;
                        goto LAB_001430f3;
                      }
                    }
                    if (psVar14 != (sqlite3_mutex *)0x0) {
                      (*sqlite3Config.mutex.xMutexEnter)(psVar14);
                      pBVar11->pNext = sqlite3SharedCacheList;
                      sqlite3SharedCacheList = pBVar11;
                      (*sqlite3Config.mutex.xMutexLeave)(psVar14);
                      goto LAB_00142d3c;
                    }
                  }
                  pBVar11->pNext = sqlite3SharedCacheList;
                  sqlite3SharedCacheList = pBVar11;
                }
LAB_00142d3c:
                if (p->sharable != '\0') {
                  uVar19 = 0;
                  uVar13 = (ulong)(uint)db->nDb;
                  if (db->nDb < 1) {
                    uVar13 = uVar19;
                  }
                  for (; uVar13 * 0x20 != uVar19; uVar19 = uVar19 + 0x20) {
                    pBVar25 = *(Btree **)((long)&db->aDb->pBt + uVar19);
                    if ((pBVar25 != (Btree *)0x0) && (pBVar25->sharable != '\0')) goto LAB_00142d7d;
                  }
                }
                goto LAB_001431f1;
              }
            }
            goto LAB_001430f3;
          }
        }
        else {
          local_9c = 0;
          iVar7 = (*pVfs->xOpen)(pVfs,pPVar12->zFilename,pPVar12->fd,uVar31 & 0x87f7f,
                                 (int *)&local_9c);
          bVar30 = (byte)(local_9c & 1);
          if (iVar7 == 0 && (local_9c & 1) == 0) {
            setSectorSize(pPVar12);
            uVar17 = pPVar12->sectorSize;
            if (0x400 < uVar17) {
              if (uVar17 < 0x2001) {
                zDbHeader[0] = (char)uVar17;
                zDbHeader[1] = (char)(uVar17 >> 8);
                zDbHeader[2] = (char)(uVar17 >> 0x10);
                zDbHeader[3] = (char)(uVar17 >> 0x18);
              }
              else {
                zDbHeader[0] = '\0';
                zDbHeader[1] = ' ';
                zDbHeader[2] = '\0';
                zDbHeader[3] = '\0';
              }
            }
            bVar30 = 0;
LAB_00142e48:
            bVar32 = true;
            uVar28 = '\0';
            goto LAB_00142e4b;
          }
          if (iVar7 == 0) goto LAB_00142e48;
        }
        psVar3 = pPVar12->fd;
        if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar3->pMethods->xClose)(psVar3);
          psVar3->pMethods = (sqlite3_io_methods *)0x0;
        }
        sqlite3_free(pPVar12);
      }
    }
LAB_001430f3:
    if (pBVar11->pPager != (Pager *)0x0) {
      sqlite3PagerClose(pBVar11->pPager);
    }
  }
  sqlite3_free(pBVar11);
  sqlite3_free(p);
  *ppBtree = (Btree *)0x0;
LAB_00143115:
  if (local_f8 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_f8);
  }
  return iVar7;
LAB_00142c94:
  ppBVar29 = &pBVar11->pNext;
  goto LAB_00142c65;
LAB_00142d7d:
  do {
    pBVar22 = pBVar25;
    pBVar25 = pBVar22->pPrev;
  } while (pBVar22->pPrev != (Btree *)0x0);
  lVar18 = 0x20;
  if (p->pBt < pBVar22->pBt) {
    ppBVar26 = &pBVar22->pPrev;
    pBVar21 = (Btree *)0x0;
    pBVar25 = p;
  }
  else {
    do {
      pBVar24 = pBVar22;
      pBVar25 = pBVar24->pNext;
      if (pBVar25 == (Btree *)0x0) {
        ppBVar26 = &pBVar24->pNext;
        pBVar22 = (Btree *)0x0;
        pBVar21 = pBVar24;
        pBVar25 = p;
        goto LAB_001431e6;
      }
      pBVar22 = pBVar25;
    } while (pBVar25->pBt < p->pBt);
    ppBVar26 = &pBVar24->pNext;
    p->pNext = pBVar25;
    lVar18 = 0x28;
    pBVar21 = p;
    pBVar22 = pBVar24;
  }
LAB_001431e6:
  *(Btree **)((long)&p->db + lVar18) = pBVar22;
  pBVar25->pPrev = pBVar21;
  *ppBVar26 = p;
LAB_001431f1:
  *ppBtree = p;
  iVar7 = 0;
  pvVar16 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
  if (pvVar16 == (void *)0x0) {
    sqlite3PagerSetCachesize(p->pBt->pPager,2000);
  }
  goto LAB_00143115;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or 
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(nFullPathname);
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, sqlite3Strlen30(zFilename)+1);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          sqlite3_free(zFullPathname);
          sqlite3_free(p);
          return rc;
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 || sizeof(i64)==4 );
    assert( sizeof(u64)==8 || sizeof(u64)==4 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );
  
    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          EXTRA_SIZE, flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyhandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;
  
    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#ifdef SQLITE_SECURE_DELETE
    pBt->btsFlags |= BTS_SECURE_DELETE;
#endif
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */
   
#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      pBt->nRef = 1;
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM;
          db->mallocFailed = 0;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( p->pBt<pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && pSib->pNext->pBt<p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3PagerSetCachesize(p->pBt->pPager, SQLITE_DEFAULT_CACHE_SIZE);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  return rc;
}